

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O0

void __thiscall
HighsObjectiveFunction::HighsObjectiveFunction
          (HighsObjectiveFunction *this,HighsMipSolver *mipsolver)

{
  bool bVar1;
  const_reference pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  difference_type dVar3;
  reference piVar4;
  long in_RSI;
  long *in_RDI;
  HighsInt i_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt i;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  anon_class_8_1_c15d7e07 __pred;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  long *local_88;
  int *local_80;
  long local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  long local_48;
  int *local_40;
  int *local_38;
  int *local_30;
  undefined4 local_24;
  int local_20;
  long local_10;
  
  *in_RDI = *(long *)(in_RSI + 0x10);
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x664001);
  __first._M_current = (int *)(in_RDI + 6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x664014);
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x664027);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x66403a);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__first._M_current);
  for (local_20 = 0; local_20 < *(int *)*in_RDI; local_20 = local_20 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)local_20);
    if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20._M_current,
                 (value_type_conflict2 *)in_stack_ffffffffffffff18);
    }
  }
  local_24 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__first._M_current,
             in_stack_ffffffffffffff30._M_current);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_current,
             in_stack_ffffffffffffff28);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20._M_current);
  if (bVar1) {
    *(undefined4 *)((long)in_RDI + 0x14) = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
    in_RDI[1] = 0x3ff0000000000000;
  }
  else {
    __pred.mipsolver = (HighsMipSolver *)(in_RDI + 3);
    local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
    local_40 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff08);
    local_48 = local_10;
    __last = std::
             partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::HighsObjectiveFunction(HighsMipSolver_const&)::__0>
                       (__first,in_stack_ffffffffffffff30,__pred);
    local_30 = __last._M_current;
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
    dVar3 = __gnu_cxx::operator-
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff08);
    *(int *)(in_RDI + 2) = (int)dVar3;
    if ((int)in_RDI[2] == 0) {
      *(undefined4 *)((long)in_RDI + 0x14) = 0;
    }
    else {
      in_stack_ffffffffffffff18 =
           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(in_RDI + 3);
      local_60 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
      local_70 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
      local_68 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_ffffffffffffff18,
                                    (difference_type)in_stack_ffffffffffffff10);
      local_78 = local_10;
      in_stack_ffffffffffffff20 =
           std::
           partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::HighsObjectiveFunction(HighsMipSolver_const&)::__1>
                     (__first,__last,__pred);
      local_58 = in_stack_ffffffffffffff20._M_current;
      local_80 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
      dVar3 = __gnu_cxx::operator-
                        (in_stack_ffffffffffffff10,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff08);
      *(int *)((long)in_RDI + 0x14) = (int)dVar3;
    }
    __lhs = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(in_RDI + 6);
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 3));
    std::vector<double,_std::allocator<double>_>::reserve(this_00,(size_type)__first._M_current);
    local_88 = in_RDI + 3;
    local_90._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff08);
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffffff08), bVar1) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_90);
      in_stack_ffffffffffffff08 = (vector<int,_std::allocator<int>_> *)(in_RDI + 6);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)*piVar4);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20._M_current,
                 (value_type_conflict1 *)in_stack_ffffffffffffff18);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_90);
    }
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

HighsObjectiveFunction::HighsObjectiveFunction(const HighsMipSolver& mipsolver)
    : model(mipsolver.model_) {
  objectiveNonzeros.reserve(model->num_col_);

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (model->col_cost_[i] != 0.0) {
      objectiveNonzeros.push_back(i);
    }
  }

  colToPartition.resize(model->num_col_, -1);
  cliquePartitionStart.resize(1);

  if (objectiveNonzeros.empty()) {
    numBinary = 0;
    numIntegral = 0;
    objIntScale = 1.0;
    return;
  }

  numIntegral =
      std::partition(objectiveNonzeros.begin(), objectiveNonzeros.end(),
                     [&](HighsInt i) {
                       return mipsolver.variableType(i) !=
                              HighsVarType::kContinuous;
                     }) -
      objectiveNonzeros.begin();

  if (numIntegral == 0)
    numBinary = 0;
  else
    numBinary =
        std::partition(objectiveNonzeros.begin(),
                       objectiveNonzeros.begin() + numIntegral,
                       [&](HighsInt i) {
                         return mipsolver.model_->col_lower_[i] == 0.0 &&
                                mipsolver.model_->col_upper_[i] == 1.0;
                       }) -
        objectiveNonzeros.begin();

  objectiveVals.reserve(objectiveNonzeros.size());
  for (HighsInt i : objectiveNonzeros)
    objectiveVals.push_back(model->col_cost_[i]);

  objIntScale = 0.0;
}